

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

PaddingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_padding(NeuralNetworkLayer *this)

{
  bool bVar1;
  PaddingLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_padding(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_padding(this);
    this_00 = (PaddingLayerParams *)operator_new(0x28);
    PaddingLayerParams::PaddingLayerParams(this_00);
    (this->layer_).padding_ = this_00;
  }
  return (PaddingLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::PaddingLayerParams* NeuralNetworkLayer::mutable_padding() {
  if (!has_padding()) {
    clear_layer();
    set_has_padding();
    layer_.padding_ = new ::CoreML::Specification::PaddingLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.padding)
  return layer_.padding_;
}